

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

bool wasm::Properties::isSymmetric(Binary *binary)

{
  Binary *binary_local;
  
  switch(binary->op) {
  case AddInt32:
  case MulInt32:
  case AndInt32:
  case OrInt32:
  case XorInt32:
  case EqInt32:
  case NeInt32:
  case AddInt64:
  case MulInt64:
  case AndInt64:
  case OrInt64:
  case XorInt64:
  case EqInt64:
  case NeInt64:
  case MinFloat32:
  case MaxFloat32:
  case EqFloat32:
  case NeFloat32:
  case MinFloat64:
  case MaxFloat64:
  case EqFloat64:
  case NeFloat64:
    binary_local._7_1_ = true;
    break;
  default:
    binary_local._7_1_ = false;
  }
  return binary_local._7_1_;
}

Assistant:

inline bool isSymmetric(Binary* binary) {
  switch (binary->op) {
    case AddInt32:
    case MulInt32:
    case AndInt32:
    case OrInt32:
    case XorInt32:
    case EqInt32:
    case NeInt32:

    case AddInt64:
    case MulInt64:
    case AndInt64:
    case OrInt64:
    case XorInt64:
    case EqInt64:
    case NeInt64:

    case MinFloat32:
    case MaxFloat32:
    case EqFloat32:
    case NeFloat32:
    case MinFloat64:
    case MaxFloat64:
    case EqFloat64:
    case NeFloat64:
      return true;

    default:
      return false;
  }
}